

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_socket.c
# Opt level: O1

int qc_tcp_connect(QcSocket *socket,char *ip,int port)

{
  int iVar1;
  ssize_t sVar2;
  int extraout_EDX;
  sockaddr_in addr;
  sockaddr local_30;
  
  if (socket == (QcSocket *)0x0) {
    qc_tcp_connect_cold_3();
  }
  else if (ip != (char *)0x0) {
    if (0 < port) {
      local_30.sa_family = 2;
      local_30.sa_data._0_2_ = (ushort)port << 8 | (ushort)port >> 8;
      local_30.sa_data._2_4_ = inet_addr(ip);
      iVar1 = connect(socket->sockfd,&local_30,0x10);
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        _qc_perror("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                   ,0xc9,"tcp connect failed (ip=%s, port=%d)",ip,(ulong)(uint)port);
        iVar1 = -1;
      }
      return iVar1;
    }
    goto LAB_00106f10;
  }
  qc_tcp_connect_cold_2();
LAB_00106f10:
  qc_tcp_connect_cold_1();
  sVar2 = send(socket->sockfd,ip,(long)extraout_EDX,0x4000);
  return (int)sVar2;
}

Assistant:

int qc_tcp_connect(QcSocket *socket, const char* ip, int port)
{
    struct sockaddr_in addr;

    qc_assert(socket);
    qc_assert(ip);
    qc_assert(port>0);

    addr.sin_family = AF_INET;
    addr.sin_port = htons(port);
    addr.sin_addr.s_addr = inet_addr(ip);

    if(0 != connect(socket->sockfd, (struct sockaddr*)&addr, sizeof(addr)))
    {
        qc_perror("tcp connect failed (ip=%s, port=%d)", ip, port);
        return -1;
    }

    return 0;
}